

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_kernel_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      _DAT_00183680 = pDdiTable->pfnCreate;
      DAT_00183688 = pDdiTable->pfnDestroy;
      pDdiTable->pfnCreate = tracing_layer::zeKernelCreate;
      pDdiTable->pfnDestroy = tracing_layer::zeKernelDestroy;
      DAT_00183690 = pDdiTable->pfnSetCacheConfig;
      DAT_00183698 = pDdiTable->pfnSetGroupSize;
      pDdiTable->pfnSetCacheConfig = tracing_layer::zeKernelSetCacheConfig;
      pDdiTable->pfnSetGroupSize = tracing_layer::zeKernelSetGroupSize;
      DAT_001836a0 = pDdiTable->pfnSuggestGroupSize;
      DAT_001836a8 = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
      pDdiTable->pfnSuggestGroupSize = tracing_layer::zeKernelSuggestGroupSize;
      pDdiTable->pfnSuggestMaxCooperativeGroupCount =
           tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;
      DAT_001836b0 = pDdiTable->pfnSetArgumentValue;
      DAT_001836b8 = pDdiTable->pfnSetIndirectAccess;
      pDdiTable->pfnSetArgumentValue = tracing_layer::zeKernelSetArgumentValue;
      pDdiTable->pfnSetIndirectAccess = tracing_layer::zeKernelSetIndirectAccess;
      DAT_001836c0 = pDdiTable->pfnGetIndirectAccess;
      DAT_001836c8 = pDdiTable->pfnGetSourceAttributes;
      pDdiTable->pfnGetIndirectAccess = tracing_layer::zeKernelGetIndirectAccess;
      pDdiTable->pfnGetSourceAttributes = tracing_layer::zeKernelGetSourceAttributes;
      _DAT_001836d0 = pDdiTable->pfnGetProperties;
      DAT_001836d8 = pDdiTable->pfnGetName;
      pDdiTable->pfnGetProperties = tracing_layer::zeKernelGetProperties;
      pDdiTable->pfnGetName = tracing_layer::zeKernelGetName;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Kernel;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeKernelCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeKernelDestroy;

    dditable.pfnSetCacheConfig                           = pDdiTable->pfnSetCacheConfig;
    pDdiTable->pfnSetCacheConfig                         = tracing_layer::zeKernelSetCacheConfig;

    dditable.pfnSetGroupSize                             = pDdiTable->pfnSetGroupSize;
    pDdiTable->pfnSetGroupSize                           = tracing_layer::zeKernelSetGroupSize;

    dditable.pfnSuggestGroupSize                         = pDdiTable->pfnSuggestGroupSize;
    pDdiTable->pfnSuggestGroupSize                       = tracing_layer::zeKernelSuggestGroupSize;

    dditable.pfnSuggestMaxCooperativeGroupCount          = pDdiTable->pfnSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = tracing_layer::zeKernelSuggestMaxCooperativeGroupCount;

    dditable.pfnSetArgumentValue                         = pDdiTable->pfnSetArgumentValue;
    pDdiTable->pfnSetArgumentValue                       = tracing_layer::zeKernelSetArgumentValue;

    dditable.pfnSetIndirectAccess                        = pDdiTable->pfnSetIndirectAccess;
    pDdiTable->pfnSetIndirectAccess                      = tracing_layer::zeKernelSetIndirectAccess;

    dditable.pfnGetIndirectAccess                        = pDdiTable->pfnGetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess                      = tracing_layer::zeKernelGetIndirectAccess;

    dditable.pfnGetSourceAttributes                      = pDdiTable->pfnGetSourceAttributes;
    pDdiTable->pfnGetSourceAttributes                    = tracing_layer::zeKernelGetSourceAttributes;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeKernelGetProperties;

    dditable.pfnGetName                                  = pDdiTable->pfnGetName;
    pDdiTable->pfnGetName                                = tracing_layer::zeKernelGetName;

    return result;
}